

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4.c
# Opt level: O1

void LZ4_memcpy_using_offset(BYTE *dstPtr,BYTE *srcPtr,BYTE *dstEnd,size_t offset)

{
  uint uVar1;
  int iVar2;
  BYTE *s;
  BYTE *pBVar3;
  BYTE *pBVar4;
  
  dstPtr[0] = '\0';
  dstPtr[1] = '\0';
  dstPtr[2] = '\0';
  dstPtr[3] = '\0';
  if (offset == 4) {
    iVar2 = *(int *)srcPtr;
  }
  else if (offset == 2) {
    iVar2 = CONCAT22(*(undefined2 *)srcPtr,*(undefined2 *)srcPtr);
  }
  else {
    if (offset != 1) {
      if (offset < 8) {
        *dstPtr = *srcPtr;
        dstPtr[1] = srcPtr[1];
        dstPtr[2] = srcPtr[2];
        dstPtr[3] = srcPtr[3];
        uVar1 = inc32table[offset];
        *(undefined4 *)(dstPtr + 4) = *(undefined4 *)(srcPtr + uVar1);
        pBVar3 = srcPtr + ((ulong)uVar1 - (long)dec64table[offset]);
      }
      else {
        *(undefined8 *)dstPtr = *(undefined8 *)srcPtr;
        pBVar3 = srcPtr + 8;
      }
      pBVar4 = dstPtr + 8;
      do {
        *(undefined8 *)pBVar4 = *(undefined8 *)pBVar3;
        pBVar4 = pBVar4 + 8;
        pBVar3 = pBVar3 + 8;
      } while (pBVar4 < dstEnd);
      return;
    }
    iVar2 = (uint)*srcPtr * 0x1010101;
  }
  do {
    *(int *)dstPtr = iVar2;
    *(int *)((long)dstPtr + 4) = iVar2;
    dstPtr = (BYTE *)((long)dstPtr + 8);
  } while (dstPtr < dstEnd);
  return;
}

Assistant:

LZ4_FORCE_O2_INLINE_GCC_PPC64LE void
LZ4_memcpy_using_offset(BYTE* dstPtr, const BYTE* srcPtr, BYTE* dstEnd, const size_t offset)
{
    BYTE v[8];

    assert(dstEnd >= dstPtr + MINMATCH);
    LZ4_write32(dstPtr, 0);   /* silence an msan warning when offset==0 */

    switch(offset) {
    case 1:
        memset(v, *srcPtr, 8);
        break;
    case 2:
        memcpy(v, srcPtr, 2);
        memcpy(&v[2], srcPtr, 2);
        memcpy(&v[4], &v[0], 4);
        break;
    case 4:
        memcpy(v, srcPtr, 4);
        memcpy(&v[4], srcPtr, 4);
        break;
    default:
        LZ4_memcpy_using_offset_base(dstPtr, srcPtr, dstEnd, offset);
        return;
    }

    memcpy(dstPtr, v, 8);
    dstPtr += 8;
    while (dstPtr < dstEnd) {
        memcpy(dstPtr, v, 8);
        dstPtr += 8;
    }
}